

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O2

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,StringRef name,int value,StringRef msg)

{
  StringRef name_00;
  int in_stack_ffffffffffffffcc;
  CStringRef in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  StringRef in_stack_ffffffffffffffe0;
  
  name_00.size_ = in_stack_ffffffffffffffd8;
  name_00.data_ = in_stack_ffffffffffffffd0.data_;
  Format<int>(name_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffe0);
  OptionError::OptionError(&this->super_OptionError,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_0025bd18;
  return;
}

Assistant:

InvalidOptionValue(fmt::StringRef name, T value, fmt::StringRef msg="")
    : OptionError(Format(name, value, msg)) {}